

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O0

void stbir__horizontal_gather_2_channels_with_7_coeffs
               (float *output_buffer,uint output_sub_size,float *decode_buffer,
               stbir__contributors *horizontal_contributors,float *horizontal_coefficients,
               int coefficient_width)

{
  float *pfVar1;
  __m128 d;
  __m128 cs;
  __m128 c;
  __m128 tot1;
  __m128 tot0;
  float *hc;
  float *decode;
  float *output;
  float *output_end;
  float *pfStack_258;
  int coefficient_width_local;
  float *horizontal_coefficients_local;
  stbir__contributors *horizontal_contributors_local;
  float *decode_buffer_local;
  uint output_sub_size_local;
  float *output_buffer_local;
  float fStack_180;
  float local_178;
  float fStack_174;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float local_138;
  float fStack_134;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  
  decode = output_buffer;
  pfStack_258 = horizontal_coefficients;
  horizontal_coefficients_local = (float *)horizontal_contributors;
  do {
    pfVar1 = decode_buffer + (int)*horizontal_coefficients_local * 2;
    local_158 = (float)*(undefined8 *)pfStack_258;
    fStack_154 = (float)((ulong)*(undefined8 *)pfStack_258 >> 0x20);
    local_e8 = (float)*(undefined8 *)pfVar1;
    fStack_e4 = (float)((ulong)*(undefined8 *)pfVar1 >> 0x20);
    fStack_e0 = (float)*(undefined8 *)(pfVar1 + 2);
    fStack_dc = (float)((ulong)*(undefined8 *)(pfVar1 + 2) >> 0x20);
    fStack_160 = (float)*(undefined8 *)(pfStack_258 + 2);
    fStack_15c = (float)((ulong)*(undefined8 *)(pfStack_258 + 2) >> 0x20);
    local_108 = (float)*(undefined8 *)(pfVar1 + 4);
    fStack_104 = (float)((ulong)*(undefined8 *)(pfVar1 + 4) >> 0x20);
    fStack_100 = (float)*(undefined8 *)(pfVar1 + 6);
    fStack_fc = (float)((ulong)*(undefined8 *)(pfVar1 + 6) >> 0x20);
    local_178 = (float)*(undefined8 *)(pfStack_258 + 4);
    fStack_174 = (float)((ulong)*(undefined8 *)(pfStack_258 + 4) >> 0x20);
    local_128 = (float)*(undefined8 *)(pfVar1 + 8);
    fStack_124 = (float)((ulong)*(undefined8 *)(pfVar1 + 8) >> 0x20);
    fStack_120 = (float)*(undefined8 *)(pfVar1 + 10);
    fStack_11c = (float)((ulong)*(undefined8 *)(pfVar1 + 10) >> 0x20);
    fStack_180 = (float)*(undefined8 *)(pfStack_258 + 6);
    local_138 = (float)*(undefined8 *)(pfVar1 + 0xc);
    fStack_134 = (float)((ulong)*(undefined8 *)(pfVar1 + 0xc) >> 0x20);
    *(ulong *)decode =
         CONCAT44(local_158 * fStack_e4 + local_178 * fStack_124 +
                  fStack_160 * fStack_104 + fStack_134 * fStack_180 +
                  fStack_154 * fStack_dc + fStack_174 * fStack_11c +
                  fStack_15c * fStack_fc + fStack_180 * 0.0,
                  local_158 * local_e8 + local_178 * local_128 +
                  fStack_160 * local_108 + local_138 * fStack_180 +
                  fStack_154 * fStack_e0 + fStack_174 * fStack_120 +
                  fStack_15c * fStack_100 + fStack_180 * 0.0);
    pfStack_258 = pfStack_258 + coefficient_width;
    horizontal_coefficients_local = horizontal_coefficients_local + 2;
    decode = decode + 2;
  } while (decode < output_buffer + (output_sub_size << 1));
  return;
}

Assistant:

static void STBIR_chans( stbir__horizontal_gather_,_channels_with_7_coeffs)( float * output_buffer, unsigned int output_sub_size, float const * decode_buffer, stbir__contributors const * horizontal_contributors, float const * horizontal_coefficients, int coefficient_width )
{
  float const * output_end = output_buffer + output_sub_size * STBIR__horizontal_channels;
  float STBIR_SIMD_STREAMOUT_PTR( * ) output = output_buffer;
  stbir__3_coeff_setup();
  STBIR_SIMD_NO_UNROLL_LOOP_START
  do {
    float const * decode = decode_buffer + horizontal_contributors->n0 * STBIR__horizontal_channels;
    float const * hc = horizontal_coefficients;

    stbir__4_coeff_start();
    stbir__3_coeff_remnant(4);
    stbir__store_output();
  } while ( output < output_end );
}